

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  pointer *pppTVar3;
  undefined4 uVar4;
  unsigned_long uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  iterator __position;
  SubGridBuildData *pSVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  size_t i;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  float *pfVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  uint uVar31;
  uint uVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  uint uVar35;
  uint uVar45;
  uint uVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  uint uVar53;
  uint uVar57;
  uint uVar58;
  undefined1 auVar54 [16];
  uint uVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint<4> iupper;
  vint<4> ilower;
  uint geomIDs [4];
  AABBNode node;
  uint primID [4];
  uint y [4];
  uint x [4];
  BBox3fa bounds [4];
  undefined8 local_290;
  uint uStack_288;
  uint uStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined1 local_270 [8];
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  uint uStack_258;
  uint uStack_254;
  ulong local_248;
  undefined1 local_240 [16];
  undefined1 local_230 [8];
  float fStack_228;
  float fStack_224;
  uint local_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  undefined1 local_210 [16];
  float local_200 [6];
  float *local_1e8;
  ulong local_1e0;
  BVHNBuilderT<embree::sse2::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *local_1d8;
  unsigned_long local_1d0;
  unsigned_long local_1c8;
  undefined8 *local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  uint auStack_130 [4];
  uint auStack_120 [4];
  uint auStack_110 [4];
  undefined8 local_100;
  char local_f8 [4];
  float afStack_f4 [49];
  undefined8 uVar47;
  
  local_1d8 = this;
  uVar5 = set->_begin;
  local_1d0 = set->_end;
  uVar17 = set->_end - uVar5;
  local_1c8 = uVar5;
  local_200[0] = prims[uVar5].lower.field_0.m128[3];
  uVar14 = 1;
  if (1 < uVar17) {
    uVar22 = 1;
    do {
      fVar49 = prims[uVar5 + uVar22].lower.field_0.m128[3];
      uVar20 = (ulong)uVar14;
      if (uVar14 != 0) {
        uVar21 = 0;
        do {
          if (fVar49 == local_200[uVar21]) goto LAB_00c046f4;
          uVar21 = uVar21 + 1;
        } while (uVar20 != uVar21);
      }
      uVar14 = uVar14 + 1;
      local_200[uVar20] = fVar49;
LAB_00c046f4:
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar17);
  }
  local_248 = (ulong)uVar14;
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  local_290 = (undefined8 *)(local_248 * 0x58);
  this_01 = pTVar6->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_f8[0] = '\x01';
    local_100 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_1c0 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_1b8 = CONCAT71(uStack_1b8._1_7_,1);
    local_260 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_260);
    }
    else {
      *__position._M_current = local_260;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_f8[0] == '\x01') {
      MutexSys::unlock(&local_100->mutex);
    }
  }
  local_1e0 = uVar17;
  pTVar6->bytesUsed = pTVar6->bytesUsed + (long)local_290;
  sVar15 = pTVar6->cur;
  uVar17 = (ulong)(-(int)sVar15 & 0xf);
  uVar22 = (long)local_290 + uVar17 + sVar15;
  pTVar6->cur = uVar22;
  if (pTVar6->end < uVar22) {
    pTVar6->cur = sVar15;
    if ((undefined8 *)pTVar6->allocBlockSize < (undefined8 *)((long)local_290 << 2)) {
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_290);
    }
    else {
      local_1c0 = (undefined8 *)pTVar6->allocBlockSize;
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_1c0);
      pTVar6->ptr = pcVar18;
      sVar15 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar15;
      pTVar6->end = (size_t)local_1c0;
      pTVar6->cur = (size_t)local_290;
      if (local_1c0 < local_290) {
        pTVar6->cur = 0;
        local_1c0 = (undefined8 *)pTVar6->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_1c0);
        pTVar6->ptr = pcVar18;
        sVar15 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar15;
        pTVar6->end = (size_t)local_1c0;
        pTVar6->cur = (size_t)local_290;
        if (local_1c0 < local_290) {
          pTVar6->cur = 0;
          pcVar18 = (char *)0x0;
          goto LAB_00c048cf;
        }
      }
      pTVar6->bytesWasted = sVar15;
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar17;
    pcVar18 = pTVar6->ptr + (uVar22 - (long)local_290);
  }
LAB_00c048cf:
  if (local_248 != 0) {
    local_1e8 = prims[uVar5].upper.field_0.m128 + 3;
    uVar17 = 0;
    pcVar24 = pcVar18;
    do {
      fVar49 = local_200[uVar17];
      uVar14 = 0;
      if (local_1d0 != local_1c8) {
        pSVar7 = (local_1d8->createLeafFunc).sgrids;
        uVar14 = 0;
        uVar22 = local_1e0;
        pfVar19 = local_1e8;
        do {
          if (pfVar19[-4] == fVar49) {
            fVar50 = *pfVar19;
            uVar20 = (ulong)uVar14;
            auStack_110[uVar20] = (uint)pSVar7[(uint)fVar50].sx;
            auStack_120[uVar20] = (uint)pSVar7[(uint)fVar50].sy;
            auStack_130[uVar20] = pSVar7[(uint)fVar50].primID;
            fVar50 = pfVar19[-6];
            fVar52 = pfVar19[-5];
            fVar51 = pfVar19[-4];
            fVar34 = pfVar19[-3];
            fVar11 = pfVar19[-2];
            fVar12 = pfVar19[-1];
            fVar13 = *pfVar19;
            *(float *)(&local_100 + uVar20 * 4) = pfVar19[-7];
            *(float *)((long)&local_100 + uVar20 * 0x20 + 4) = fVar50;
            *(float *)((long)local_f8 + uVar20 * 8 * 4) = fVar52;
            *(float *)((long)local_f8 + (uVar20 * 8 + 1) * 4) = fVar51;
            *(float *)((long)local_f8 + (uVar20 * 8 + 2) * 4) = fVar34;
            *(float *)((long)local_f8 + (uVar20 * 8 + 3) * 4) = fVar11;
            *(float *)((long)local_f8 + (uVar20 * 8 + 4) * 4) = fVar12;
            *(float *)((long)local_f8 + (uVar20 * 8 + 5) * 4) = fVar13;
            uVar14 = uVar14 + 1;
          }
          pfVar19 = pfVar19 + 8;
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
      }
      lVar23 = uVar17 * 0x58;
      pcVar2 = pcVar18 + lVar23;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = -1;
      pcVar2[5] = -1;
      pcVar2[6] = -1;
      pcVar2[7] = -1;
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = -1;
      pcVar2[0xd] = -1;
      pcVar2[0xe] = -1;
      pcVar2[0xf] = -1;
      pcVar2 = pcVar18 + lVar23 + 0x10;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = -1;
      pcVar2[5] = -1;
      pcVar2[6] = -1;
      pcVar2[7] = -1;
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = -1;
      pcVar2[0xd] = -1;
      pcVar2[0xe] = -1;
      pcVar2[0xf] = -1;
      pcVar2 = pcVar18 + lVar23 + 0x20;
      pcVar2[0] = -1;
      pcVar2[1] = -1;
      pcVar2[2] = -1;
      pcVar2[3] = -1;
      pcVar2 = pcVar18 + lVar23 + 0x30;
      pcVar2[0] = -1;
      pcVar2[1] = -1;
      pcVar2[2] = -1;
      pcVar2[3] = -1;
      pcVar2 = pcVar18 + lVar23 + 0x28;
      pcVar2[0] = -1;
      pcVar2[1] = -1;
      pcVar2[2] = -1;
      pcVar2[3] = -1;
      pcVar2 = pcVar18 + lVar23 + 0x24;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2 = pcVar18 + lVar23 + 0x34;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2 = pcVar18 + lVar23 + 0x2c;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      *(float *)(pcVar18 + lVar23 + 0x50) = fVar49;
      local_160 = 0x7f8000007f800000;
      uStack_158 = 0x7f8000007f800000;
      local_180 = 0x7f8000007f800000;
      uStack_178 = 0x7f8000007f800000;
      local_1a0 = 0x7f8000007f800000;
      uStack_198 = 0x7f8000007f800000;
      local_150 = 0xff800000ff800000;
      uStack_148 = 0xff800000ff800000;
      local_170 = 0xff800000ff800000;
      uStack_168 = 0xff800000ff800000;
      local_190 = 0xff800000ff800000;
      uStack_188 = 0xff800000ff800000;
      local_1c0 = (undefined8 *)0x8;
      uStack_1b8 = 8;
      local_1b0 = 8;
      uStack_1a8 = 8;
      if (uVar14 != 0) {
        lVar16 = 0;
        do {
          *(ulong *)(pcVar24 + lVar16 * 2) =
               CONCAT44(*(undefined4 *)((long)auStack_130 + lVar16),
                        *(int *)((long)auStack_120 + lVar16) << 0x10 |
                        (uint)*(ushort *)((long)auStack_110 + lVar16));
          uVar4 = *(undefined4 *)((long)&local_100 + lVar16 * 8 + 4);
          *(undefined4 *)((long)&local_1a0 + lVar16) = *(undefined4 *)(&local_100 + lVar16);
          *(undefined4 *)((long)&local_180 + lVar16) = uVar4;
          *(undefined4 *)((long)&local_160 + lVar16) =
               *(undefined4 *)((long)local_f8 + lVar16 * 2 * 4);
          *(undefined4 *)((long)&local_190 + lVar16) =
               *(undefined4 *)((long)local_f8 + (lVar16 * 2 + 2) * 4);
          *(undefined4 *)((long)&local_170 + lVar16) =
               *(undefined4 *)((long)local_f8 + (lVar16 * 2 + 3) * 4);
          *(undefined4 *)((long)&local_150 + lVar16) =
               *(undefined4 *)((long)local_f8 + (lVar16 * 2 + 4) * 4);
          lVar16 = lVar16 + 4;
        } while ((ulong)uVar14 << 2 != lVar16);
      }
      unique0x10001793 = uStack_198;
      local_230 = local_1a0;
      fVar49 = (float)local_1a0;
      fVar50 = (float)((ulong)local_1a0 >> 0x20);
      fVar51 = (float)uStack_198;
      fVar52 = (float)((ulong)uStack_198 >> 0x20);
      unique0x100017a3 = uStack_188;
      local_270 = local_190;
      local_220 = -(uint)(fVar49 != INFINITY);
      uStack_21c = -(uint)(fVar50 != INFINITY);
      uStack_218 = -(uint)(fVar51 != INFINITY);
      uStack_214 = -(uint)(fVar52 != INFINITY);
      auVar25._4_4_ = fVar49;
      auVar25._0_4_ = fVar50;
      auVar25._8_4_ = fVar52;
      auVar25._12_4_ = fVar51;
      auVar25 = minps(auVar25,_local_230);
      auVar54._0_8_ = auVar25._8_8_;
      auVar54._8_4_ = auVar25._0_4_;
      auVar54._12_4_ = auVar25._4_4_;
      local_210 = minps(auVar54,auVar25);
      auVar26._4_4_ = (int)local_190;
      auVar26._0_4_ = (int)((ulong)local_190 >> 0x20);
      auVar26._8_4_ = (int)((ulong)uStack_188 >> 0x20);
      auVar26._12_4_ = (int)uStack_188;
      auVar25 = maxps(auVar26,_local_270);
      auVar8._4_8_ = uStack_188;
      auVar8._0_4_ = auVar25._4_4_;
      auVar36._0_8_ = auVar8._0_8_ << 0x20;
      auVar36._8_4_ = auVar25._8_4_;
      auVar36._12_4_ = auVar25._12_4_;
      uVar47 = auVar36._8_8_;
      auVar37._8_8_ = auVar25._8_8_;
      auVar37._0_8_ = uVar47;
      if (auVar25._8_4_ <= auVar25._0_4_) {
        auVar38._4_12_ = auVar37._4_12_;
        auVar38._0_4_ = auVar25._0_4_;
        uVar47 = auVar38._0_8_;
      }
      local_280 = local_210._0_4_;
      fVar34 = ((float)uVar47 - local_280) * 1.0000002;
      uVar14 = -(uint)(fVar34 / 255.0 == 0.0);
      auVar60._0_8_ = (ulong)uVar14 & 0xffffffff01000000;
      auVar60._8_8_ = 0;
      local_240 = auVar60 | ZEXT416(~uVar14 & (uint)(fVar34 / 255.0));
      fVar34 = (float)(-(uint)(0.0 < fVar34) & (uint)(255.0 / fVar34));
      fVar49 = fVar49 - local_280;
      fVar50 = fVar50 - local_280;
      fVar52 = fVar52 - local_280;
      fStack_27c = local_280;
      fStack_278 = local_280;
      fStack_274 = local_280;
      fVar51 = floorf((fVar51 - local_280) * fVar34);
      fVar52 = floorf(fVar52 * fVar34);
      fVar49 = floorf(fVar49 * fVar34);
      fVar50 = floorf(fVar50 * fVar34);
      uVar35 = ~((int)fVar49 >> 0x1f) & (int)fVar49;
      uVar45 = ~((int)fVar50 >> 0x1f) & (int)fVar50;
      uVar46 = ~((int)fVar51 >> 0x1f) & (int)fVar51;
      uVar48 = ~((int)fVar52 >> 0x1f) & (int)fVar52;
      fVar49 = (float)local_270._0_4_ - local_280;
      fVar51 = (float)local_270._4_4_ - fStack_27c;
      fVar52 = fStack_264 - fStack_274;
      fVar50 = ceilf((fStack_268 - fStack_278) * fVar34);
      fVar52 = ceilf(fVar52 * fVar34);
      fVar49 = ceilf(fVar49 * fVar34);
      fVar51 = ceilf(fVar51 * fVar34);
      uVar14 = -(uint)(0xfe < (int)fVar49);
      uVar31 = -(uint)(0xfe < (int)fVar51);
      uVar32 = -(uint)(0xfe < (int)fVar50);
      uVar33 = -(uint)(0xfe < (int)fVar52);
      uVar53 = uVar14 & 0xff | ~uVar14 & (int)fVar49;
      uVar57 = uVar31 & 0xff | ~uVar31 & (int)fVar51;
      uVar58 = uVar32 & 0xff | ~uVar32 & (int)fVar50;
      uVar59 = uVar33 & 0xff | ~uVar33 & (int)fVar52;
      uVar14 = -(uint)((float)(int)uVar35 * (float)local_240._0_4_ + local_280 <=
                      (float)local_230._0_4_);
      uVar31 = -(uint)((float)(int)uVar45 * (float)local_240._0_4_ + fStack_27c <=
                      (float)local_230._4_4_);
      uVar32 = -(uint)((float)(int)uVar46 * (float)local_240._0_4_ + fStack_278 <= fStack_228);
      uVar33 = -(uint)((float)(int)uVar48 * (float)local_240._0_4_ + fStack_274 <= fStack_224);
      uVar35 = ~uVar14 & uVar35 - 1 | uVar35 & uVar14;
      uVar45 = ~uVar31 & uVar45 - 1 | uVar45 & uVar31;
      uVar46 = ~uVar32 & uVar46 - 1 | uVar46 & uVar32;
      uVar48 = ~uVar33 & uVar48 - 1 | uVar48 & uVar33;
      uVar14 = -(uint)((float)local_270._0_4_ <=
                      (float)(int)uVar53 * (float)local_240._0_4_ + local_280);
      uVar31 = -(uint)((float)local_270._4_4_ <=
                      (float)(int)uVar57 * (float)local_240._0_4_ + fStack_27c);
      uVar32 = -(uint)(fStack_268 <= (float)(int)uVar58 * (float)local_240._0_4_ + fStack_278);
      uVar33 = -(uint)(fStack_264 <= (float)(int)uVar59 * (float)local_240._0_4_ + fStack_274);
      uVar53 = ~uVar14 & uVar53 + 1 | uVar53 & uVar14;
      uVar57 = ~uVar31 & uVar57 + 1 | uVar57 & uVar31;
      uVar58 = ~uVar32 & uVar58 + 1 | uVar58 & uVar32;
      uVar59 = ~uVar33 & uVar59 + 1 | uVar59 & uVar33;
      uVar14 = -(uint)(0xfe < (int)uVar53);
      uVar31 = -(uint)(0xfe < (int)uVar57);
      uVar32 = -(uint)(0xfe < (int)uVar58);
      uVar33 = -(uint)(0xfe < (int)uVar59);
      local_260 = (ThreadLocal2 *)
                  CONCAT44(~uStack_21c & 0xff | ~((int)uVar45 >> 0x1f) & uVar45 & uStack_21c,
                           ~local_220 & 0xff | ~((int)uVar35 >> 0x1f) & uVar35 & local_220);
      uStack_258 = ~uStack_218 & 0xff | ~((int)uVar46 >> 0x1f) & uVar46 & uStack_218;
      uStack_254 = ~uStack_214 & 0xff | ~((int)uVar48 >> 0x1f) & uVar48 & uStack_214;
      local_290 = (undefined8 *)
                  CONCAT44((uVar31 & 0xff | ~uVar31 & uVar57) & uStack_21c,
                           (uVar14 & 0xff | ~uVar14 & uVar53) & local_220);
      uStack_288 = (uVar32 & 0xff | ~uVar32 & uVar58) & uStack_218;
      uStack_284 = (uVar33 & 0xff | ~uVar33 & uVar59) & uStack_214;
      lVar16 = 0;
      do {
        pcVar24[lVar16 + 0x20] = *(char *)((long)&local_260 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      lVar16 = 0;
      do {
        pcVar24[lVar16 + 0x24] = *(char *)((long)&local_290 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      *(undefined4 *)(pcVar18 + lVar23 + 0x38) = local_210._0_4_;
      *(undefined4 *)(pcVar18 + lVar23 + 0x44) = local_240._0_4_;
      unique0x100017b3 = uStack_178;
      local_230 = local_180;
      fVar49 = (float)local_180;
      fVar50 = (float)((ulong)local_180 >> 0x20);
      fVar51 = (float)uStack_178;
      fVar52 = (float)((ulong)uStack_178 >> 0x20);
      unique0x100017c3 = uStack_168;
      local_270 = local_170;
      local_220 = -(uint)(fVar49 != INFINITY);
      uStack_21c = -(uint)(fVar50 != INFINITY);
      uStack_218 = -(uint)(fVar51 != INFINITY);
      uStack_214 = -(uint)(fVar52 != INFINITY);
      auVar27._4_4_ = fVar49;
      auVar27._0_4_ = fVar50;
      auVar27._8_4_ = fVar52;
      auVar27._12_4_ = fVar51;
      auVar25 = minps(auVar27,_local_230);
      auVar55._0_8_ = auVar25._8_8_;
      auVar55._8_4_ = auVar25._0_4_;
      auVar55._12_4_ = auVar25._4_4_;
      local_210 = minps(auVar55,auVar25);
      auVar28._4_4_ = (int)local_170;
      auVar28._0_4_ = (int)((ulong)local_170 >> 0x20);
      auVar28._8_4_ = (int)((ulong)uStack_168 >> 0x20);
      auVar28._12_4_ = (int)uStack_168;
      auVar25 = maxps(auVar28,_local_270);
      auVar9._4_8_ = uStack_168;
      auVar9._0_4_ = auVar25._4_4_;
      auVar39._0_8_ = auVar9._0_8_ << 0x20;
      auVar39._8_4_ = auVar25._8_4_;
      auVar39._12_4_ = auVar25._12_4_;
      uVar47 = auVar39._8_8_;
      auVar40._8_8_ = auVar25._8_8_;
      auVar40._0_8_ = uVar47;
      if (auVar25._8_4_ <= auVar25._0_4_) {
        auVar41._4_12_ = auVar40._4_12_;
        auVar41._0_4_ = auVar25._0_4_;
        uVar47 = auVar41._0_8_;
      }
      local_280 = local_210._0_4_;
      fVar34 = ((float)uVar47 - local_280) * 1.0000002;
      uVar14 = -(uint)(fVar34 / 255.0 == 0.0);
      auVar61._0_8_ = (ulong)uVar14 & 0xffffffff01000000;
      auVar61._8_8_ = 0;
      local_240 = auVar61 | ZEXT416(~uVar14 & (uint)(fVar34 / 255.0));
      fVar34 = (float)(-(uint)(0.0 < fVar34) & (uint)(255.0 / fVar34));
      fVar49 = fVar49 - local_280;
      fVar50 = fVar50 - local_280;
      fVar52 = fVar52 - local_280;
      fStack_27c = local_280;
      fStack_278 = local_280;
      fStack_274 = local_280;
      fVar51 = floorf((fVar51 - local_280) * fVar34);
      fVar52 = floorf(fVar52 * fVar34);
      fVar49 = floorf(fVar49 * fVar34);
      fVar50 = floorf(fVar50 * fVar34);
      uVar35 = ~((int)fVar49 >> 0x1f) & (int)fVar49;
      uVar45 = ~((int)fVar50 >> 0x1f) & (int)fVar50;
      uVar46 = ~((int)fVar51 >> 0x1f) & (int)fVar51;
      uVar48 = ~((int)fVar52 >> 0x1f) & (int)fVar52;
      fVar49 = (float)local_270._0_4_ - local_280;
      fVar51 = (float)local_270._4_4_ - fStack_27c;
      fVar52 = fStack_264 - fStack_274;
      fVar50 = ceilf((fStack_268 - fStack_278) * fVar34);
      fVar52 = ceilf(fVar52 * fVar34);
      fVar49 = ceilf(fVar49 * fVar34);
      fVar51 = ceilf(fVar51 * fVar34);
      uVar14 = -(uint)(0xfe < (int)fVar49);
      uVar31 = -(uint)(0xfe < (int)fVar51);
      uVar32 = -(uint)(0xfe < (int)fVar50);
      uVar33 = -(uint)(0xfe < (int)fVar52);
      uVar53 = uVar14 & 0xff | ~uVar14 & (int)fVar49;
      uVar57 = uVar31 & 0xff | ~uVar31 & (int)fVar51;
      uVar58 = uVar32 & 0xff | ~uVar32 & (int)fVar50;
      uVar59 = uVar33 & 0xff | ~uVar33 & (int)fVar52;
      uVar14 = -(uint)((float)(int)uVar35 * (float)local_240._0_4_ + local_280 <=
                      (float)local_230._0_4_);
      uVar31 = -(uint)((float)(int)uVar45 * (float)local_240._0_4_ + fStack_27c <=
                      (float)local_230._4_4_);
      uVar32 = -(uint)((float)(int)uVar46 * (float)local_240._0_4_ + fStack_278 <= fStack_228);
      uVar33 = -(uint)((float)(int)uVar48 * (float)local_240._0_4_ + fStack_274 <= fStack_224);
      uVar35 = ~uVar14 & uVar35 - 1 | uVar35 & uVar14;
      uVar45 = ~uVar31 & uVar45 - 1 | uVar45 & uVar31;
      uVar46 = ~uVar32 & uVar46 - 1 | uVar46 & uVar32;
      uVar48 = ~uVar33 & uVar48 - 1 | uVar48 & uVar33;
      uVar14 = -(uint)((float)local_270._0_4_ <=
                      (float)(int)uVar53 * (float)local_240._0_4_ + local_280);
      uVar31 = -(uint)((float)local_270._4_4_ <=
                      (float)(int)uVar57 * (float)local_240._0_4_ + fStack_27c);
      uVar32 = -(uint)(fStack_268 <= (float)(int)uVar58 * (float)local_240._0_4_ + fStack_278);
      uVar33 = -(uint)(fStack_264 <= (float)(int)uVar59 * (float)local_240._0_4_ + fStack_274);
      uVar53 = ~uVar14 & uVar53 + 1 | uVar53 & uVar14;
      uVar57 = ~uVar31 & uVar57 + 1 | uVar57 & uVar31;
      uVar58 = ~uVar32 & uVar58 + 1 | uVar58 & uVar32;
      uVar59 = ~uVar33 & uVar59 + 1 | uVar59 & uVar33;
      uVar14 = -(uint)(0xfe < (int)uVar53);
      uVar31 = -(uint)(0xfe < (int)uVar57);
      uVar32 = -(uint)(0xfe < (int)uVar58);
      uVar33 = -(uint)(0xfe < (int)uVar59);
      local_260 = (ThreadLocal2 *)
                  CONCAT44(~uStack_21c & 0xff | ~((int)uVar45 >> 0x1f) & uVar45 & uStack_21c,
                           ~local_220 & 0xff | ~((int)uVar35 >> 0x1f) & uVar35 & local_220);
      uStack_258 = ~uStack_218 & 0xff | ~((int)uVar46 >> 0x1f) & uVar46 & uStack_218;
      uStack_254 = ~uStack_214 & 0xff | ~((int)uVar48 >> 0x1f) & uVar48 & uStack_214;
      local_290 = (undefined8 *)
                  CONCAT44((uVar31 & 0xff | ~uVar31 & uVar57) & uStack_21c,
                           (uVar14 & 0xff | ~uVar14 & uVar53) & local_220);
      uStack_288 = (uVar32 & 0xff | ~uVar32 & uVar58) & uStack_218;
      uStack_284 = (uVar33 & 0xff | ~uVar33 & uVar59) & uStack_214;
      lVar16 = 0;
      do {
        pcVar24[lVar16 + 0x28] = *(char *)((long)&local_260 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      lVar16 = 0;
      do {
        pcVar24[lVar16 + 0x2c] = *(char *)((long)&local_290 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      *(undefined4 *)(pcVar18 + lVar23 + 0x3c) = local_210._0_4_;
      *(undefined4 *)(pcVar18 + lVar23 + 0x48) = local_240._0_4_;
      unique0x100017d3 = uStack_158;
      local_230 = local_160;
      fVar49 = (float)local_160;
      fVar50 = (float)((ulong)local_160 >> 0x20);
      fVar51 = (float)uStack_158;
      fVar52 = (float)((ulong)uStack_158 >> 0x20);
      unique0x100017e3 = uStack_148;
      local_270 = local_150;
      local_220 = -(uint)(fVar49 != INFINITY);
      uStack_21c = -(uint)(fVar50 != INFINITY);
      uStack_218 = -(uint)(fVar51 != INFINITY);
      uStack_214 = -(uint)(fVar52 != INFINITY);
      auVar29._4_4_ = fVar49;
      auVar29._0_4_ = fVar50;
      auVar29._8_4_ = fVar52;
      auVar29._12_4_ = fVar51;
      auVar25 = minps(auVar29,_local_230);
      auVar56._0_8_ = auVar25._8_8_;
      auVar56._8_4_ = auVar25._0_4_;
      auVar56._12_4_ = auVar25._4_4_;
      local_210 = minps(auVar56,auVar25);
      auVar30._4_4_ = (int)local_150;
      auVar30._0_4_ = (int)((ulong)local_150 >> 0x20);
      auVar30._8_4_ = (int)((ulong)uStack_148 >> 0x20);
      auVar30._12_4_ = (int)uStack_148;
      auVar25 = maxps(auVar30,_local_270);
      auVar10._4_8_ = uStack_148;
      auVar10._0_4_ = auVar25._4_4_;
      auVar42._0_8_ = auVar10._0_8_ << 0x20;
      auVar42._8_4_ = auVar25._8_4_;
      auVar42._12_4_ = auVar25._12_4_;
      uVar47 = auVar42._8_8_;
      auVar43._8_8_ = auVar25._8_8_;
      auVar43._0_8_ = uVar47;
      if (auVar25._8_4_ <= auVar25._0_4_) {
        auVar44._4_12_ = auVar43._4_12_;
        auVar44._0_4_ = auVar25._0_4_;
        uVar47 = auVar44._0_8_;
      }
      local_280 = local_210._0_4_;
      fVar34 = ((float)uVar47 - local_280) * 1.0000002;
      uVar14 = -(uint)(fVar34 / 255.0 == 0.0);
      auVar62._0_8_ = (ulong)uVar14 & 0xffffffff01000000;
      auVar62._8_8_ = 0;
      local_240 = auVar62 | ZEXT416(~uVar14 & (uint)(fVar34 / 255.0));
      fVar34 = (float)(-(uint)(0.0 < fVar34) & (uint)(255.0 / fVar34));
      fVar49 = fVar49 - local_280;
      fVar50 = fVar50 - local_280;
      fVar52 = fVar52 - local_280;
      fStack_27c = local_280;
      fStack_278 = local_280;
      fStack_274 = local_280;
      fVar51 = floorf((fVar51 - local_280) * fVar34);
      fVar52 = floorf(fVar52 * fVar34);
      fVar49 = floorf(fVar49 * fVar34);
      fVar50 = floorf(fVar50 * fVar34);
      uVar35 = ~((int)fVar49 >> 0x1f) & (int)fVar49;
      uVar45 = ~((int)fVar50 >> 0x1f) & (int)fVar50;
      uVar46 = ~((int)fVar51 >> 0x1f) & (int)fVar51;
      uVar48 = ~((int)fVar52 >> 0x1f) & (int)fVar52;
      fVar49 = (float)local_270._0_4_ - local_280;
      fVar51 = (float)local_270._4_4_ - fStack_27c;
      fVar52 = fStack_264 - fStack_274;
      fVar50 = ceilf((fStack_268 - fStack_278) * fVar34);
      fVar52 = ceilf(fVar52 * fVar34);
      fVar49 = ceilf(fVar49 * fVar34);
      fVar51 = ceilf(fVar51 * fVar34);
      uVar14 = -(uint)(0xfe < (int)fVar49);
      uVar31 = -(uint)(0xfe < (int)fVar51);
      uVar32 = -(uint)(0xfe < (int)fVar50);
      uVar33 = -(uint)(0xfe < (int)fVar52);
      uVar53 = uVar14 & 0xff | ~uVar14 & (int)fVar49;
      uVar57 = uVar31 & 0xff | ~uVar31 & (int)fVar51;
      uVar58 = uVar32 & 0xff | ~uVar32 & (int)fVar50;
      uVar59 = uVar33 & 0xff | ~uVar33 & (int)fVar52;
      uVar14 = -(uint)((float)(int)uVar35 * (float)local_240._0_4_ + local_280 <=
                      (float)local_230._0_4_);
      uVar31 = -(uint)((float)(int)uVar45 * (float)local_240._0_4_ + fStack_27c <=
                      (float)local_230._4_4_);
      uVar32 = -(uint)((float)(int)uVar46 * (float)local_240._0_4_ + fStack_278 <= fStack_228);
      uVar33 = -(uint)((float)(int)uVar48 * (float)local_240._0_4_ + fStack_274 <= fStack_224);
      uVar35 = ~uVar14 & uVar35 - 1 | uVar35 & uVar14;
      uVar45 = ~uVar31 & uVar45 - 1 | uVar45 & uVar31;
      uVar46 = ~uVar32 & uVar46 - 1 | uVar46 & uVar32;
      uVar48 = ~uVar33 & uVar48 - 1 | uVar48 & uVar33;
      uVar14 = -(uint)((float)local_270._0_4_ <=
                      (float)(int)uVar53 * (float)local_240._0_4_ + local_280);
      uVar31 = -(uint)((float)local_270._4_4_ <=
                      (float)(int)uVar57 * (float)local_240._0_4_ + fStack_27c);
      uVar32 = -(uint)(fStack_268 <= (float)(int)uVar58 * (float)local_240._0_4_ + fStack_278);
      uVar33 = -(uint)(fStack_264 <= (float)(int)uVar59 * (float)local_240._0_4_ + fStack_274);
      uVar53 = ~uVar14 & uVar53 + 1 | uVar53 & uVar14;
      uVar57 = ~uVar31 & uVar57 + 1 | uVar57 & uVar31;
      uVar58 = ~uVar32 & uVar58 + 1 | uVar58 & uVar32;
      uVar59 = ~uVar33 & uVar59 + 1 | uVar59 & uVar33;
      uVar14 = -(uint)(0xfe < (int)uVar53);
      uVar31 = -(uint)(0xfe < (int)uVar57);
      uVar32 = -(uint)(0xfe < (int)uVar58);
      uVar33 = -(uint)(0xfe < (int)uVar59);
      local_260 = (ThreadLocal2 *)
                  CONCAT44(~uStack_21c & 0xff | ~((int)uVar45 >> 0x1f) & uVar45 & uStack_21c,
                           ~local_220 & 0xff | ~((int)uVar35 >> 0x1f) & uVar35 & local_220);
      uStack_258 = ~uStack_218 & 0xff | ~((int)uVar46 >> 0x1f) & uVar46 & uStack_218;
      uStack_254 = ~uStack_214 & 0xff | ~((int)uVar48 >> 0x1f) & uVar48 & uStack_214;
      local_290 = (undefined8 *)
                  CONCAT44((uVar31 & 0xff | ~uVar31 & uVar57) & uStack_21c,
                           (uVar14 & 0xff | ~uVar14 & uVar53) & local_220);
      uStack_288 = (uVar32 & 0xff | ~uVar32 & uVar58) & uStack_218;
      uStack_284 = (uVar33 & 0xff | ~uVar33 & uVar59) & uStack_214;
      lVar16 = 0;
      do {
        pcVar24[lVar16 + 0x30] = *(char *)((long)&local_260 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      lVar16 = 0;
      do {
        pcVar24[lVar16 + 0x34] = *(char *)((long)&local_290 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      *(undefined4 *)(pcVar18 + lVar23 + 0x40) = local_210._0_4_;
      *(undefined4 *)(pcVar18 + lVar23 + 0x4c) = local_240._0_4_;
      uVar17 = uVar17 + 1;
      pcVar24 = pcVar24 + 0x58;
    } while (uVar17 != local_248);
  }
  uVar17 = 7;
  if (local_248 < 7) {
    uVar17 = local_248;
  }
  return (NodeRef)(uVar17 | (ulong)pcVar18 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }